

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat3 * dja::mat3::rotation(quaternion *q)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  mat3 *in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = (q->im).x;
  fVar7 = fVar1 + fVar1;
  fVar5 = q->re + q->re;
  fVar4 = 1.0 - fVar1 * fVar7;
  uVar2 = (q->im).y;
  uVar3 = (q->im).z;
  fVar6 = (float)uVar2 * ((float)uVar2 + (float)uVar2);
  fVar9 = ((float)uVar2 + (float)uVar2) * (float)uVar3;
  fVar8 = ((float)uVar3 + (float)uVar3) * (float)uVar3;
  in_RDI->m[0].x = (1.0 - fVar6) - fVar8;
  in_RDI->m[0].y = (float)uVar2 * fVar7 + fVar5 * (float)uVar3;
  *(ulong *)&in_RDI->m[0].z =
       CONCAT44((float)uVar2 * fVar7 - fVar5 * (float)uVar3,
                (float)uVar3 * fVar7 - fVar5 * (float)uVar2);
  in_RDI->m[1].y = fVar4 - fVar8;
  in_RDI->m[1].z = fVar9 + fVar1 * fVar5;
  in_RDI->m[2].x = (float)uVar3 * fVar7 + fVar5 * (float)uVar2;
  in_RDI->m[2].y = fVar9 - fVar1 * fVar5;
  in_RDI->m[2].z = fVar4 - fVar6;
  return in_RDI;
}

Assistant:

mat3 mat3::rotation(const quaternion& q)
{
    float_t jj2 = float_t(2) * q[2] * q[2];
    float_t ij2 = float_t(2) * q[1] * q[2];
    float_t ik2 = float_t(2) * q[1] * q[3];
    float_t jk2 = float_t(2) * q[2] * q[3];
    float_t kk2 = float_t(2) * q[3] * q[3];
    float_t rk2 = float_t(2) * q[0] * q[3];
    float_t rj2 = float_t(2) * q[0] * q[2];
    float_t ri2 = float_t(2) * q[0] * q[1];
    float_t ii2 = float_t(2) * q[1] * q[1];

    return mat3(float_t(1) - jj2 - kk2, ij2 + rk2, ik2 - rj2,
                ij2 - rk2, float_t(1) - ii2 - kk2, jk2 + ri2,
                ik2 + rj2, jk2 - ri2, float_t(1) - ii2 - jj2);
}